

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

iterator __thiscall
nestl::impl::vector<int,nestl::allocator<int>>::
insert_value<nestl::has_exceptions::exception_ptr_error,int_const&>
          (vector<int,nestl::allocator<int>> *this,exception_ptr_error *err,const_iterator pos,
          int *args)

{
  const_iterator piVar1;
  bool bVar2;
  iterator piVar3;
  const_iterator piVar4;
  iterator piVar5;
  
  piVar1 = *(const_iterator *)(this + 8);
  if (pos < piVar1) {
    __assert_fail("pos >= m_start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2bd,
                  "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <const int &>]"
                 );
  }
  piVar3 = *(iterator *)(this + 0x10);
  if (piVar3 < pos) {
    __assert_fail("pos <= m_finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2be,
                  "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <const int &>]"
                 );
  }
  piVar5 = *(iterator *)(this + 0x18);
  piVar4 = piVar1;
  if (piVar5 == piVar3) {
    vector<int,_nestl::allocator<int>_>::grow<nestl::has_exceptions::exception_ptr_error>
              ((vector<int,_nestl::allocator<int>_> *)this,err,
               ((long)piVar3 - (long)piVar1 >> 2) + 1);
    bVar2 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    if (bVar2) goto LAB_00109e09;
    piVar3 = *(iterator *)(this + 0x10);
    piVar5 = *(iterator *)(this + 0x18);
    piVar4 = *(const_iterator *)(this + 8);
  }
  if ((ulong)((long)piVar5 - (long)piVar4) <= (ulong)((long)piVar3 - (long)piVar4)) {
    __assert_fail("capacity() > size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2cb,
                  "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <const int &>]"
                 );
  }
  piVar5 = (iterator)((long)piVar4 + ((long)pos - (long)piVar1));
  do {
    if (piVar3 == piVar5) {
      *piVar5 = *args;
      bVar2 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
      if (bVar2) {
        return *(iterator *)(this + 0x10);
      }
      *(iterator *)(this + 0x10) = *(iterator *)(this + 0x10) + 1;
      return piVar5;
    }
    *piVar3 = piVar3[-1];
    bVar2 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    piVar3 = piVar3 + -1;
  } while (!bVar2);
LAB_00109e09:
  return *(iterator *)(this + 0x10);
}

Assistant:

typename vector<T, A>::iterator
vector<T, A>::insert_value(OperationError& err, const_iterator pos, Args&& ... args) NESTL_NOEXCEPT_SPEC
{
    assert(pos >= m_start);
    assert(pos <= m_finish);

    /// we should calculate offset before possible reallocation
    size_t offset = pos - m_start;

    if (capacity() == size())
    {
        grow(err, capacity() + 1);
        if (err)
        {
            return end();
        }
    }
    assert(capacity() > size());

    value_type* last = m_finish;
    value_type* first = m_start + offset;
    for (value_type* val = last; val != first; --val)
    {
        value_type* oldLocation = val - 1;
        nestl::class_operations::construct(err, val, *oldLocation);
        if (err)
        {
            return end();
        }
        nestl::detail::destroy(oldLocation, val);
    }


	nestl::class_operations::construct(err, first, std::forward<Args>(args) ...);
    if (err)
    {
        return end();
    }

    ++m_finish;
    return first;
}